

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::validate_setting(session_impl *this,int int_name,int min,int max)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = session_settings::get_int(&this->m_settings,int_name);
  if ((int)uVar1 < min || max < (int)uVar1) {
    pcVar2 = name_for_setting(int_name);
    session_log(this,"invalid %s setting: %d",pcVar2,(ulong)uVar1);
    return;
  }
  return;
}

Assistant:

void session_impl::validate_setting(int const int_name, int const min, int const max)
	{
		int const val = m_settings.get_int(int_name);
		TORRENT_ASSERT_PRECOND_MSG(val >= min, name_for_setting(int_name));
		TORRENT_ASSERT_PRECOND_MSG(val <= max, name_for_setting(int_name));
#ifndef TORRENT_DISABLE_LOGGING
		if (val < min || val > max)
			session_log("invalid %s setting: %d", name_for_setting(int_name), val);
#endif
	}